

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O3

void h265e_slice_set_ref_poc_list(H265eSlice *slice)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_slice_set_ref_poc_list");
  }
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if (0 < slice->m_numRefIdx[lVar3]) {
      lVar4 = 0;
      do {
        slice->m_refPOCList[lVar3][lVar4] = slice->m_refPicList[lVar3][lVar4]->poc;
        lVar4 = lVar4 + 1;
      } while (lVar4 < slice->m_numRefIdx[lVar3]);
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_slice","leave\n","h265e_slice_set_ref_poc_list");
  return;
}

Assistant:

void h265e_slice_set_ref_poc_list(H265eSlice *slice)
{
    RK_S32 dir, numRefIdx;

    h265e_dbg_func("enter\n");

    for (dir = 0; dir < 2; dir++) {
        for (numRefIdx = 0; numRefIdx < slice->m_numRefIdx[dir]; numRefIdx++) {
            slice->m_refPOCList[dir][numRefIdx] = slice->m_refPicList[dir][numRefIdx]->poc;
        }
    }

    h265e_dbg_func("leave\n");
}